

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

bool basisu::etc_block::unpack_color5
               (color_rgba *result,uint16_t packed_color5,uint16_t packed_delta3,bool scaled,
               uint32_t alpha)

{
  uint uVar1;
  color_rgba_i16 cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  
  cVar2 = unpack_delta3(packed_delta3);
  uVar5 = (cVar2.field_0._2_4_ >> 0x10) + (packed_color5 & 0x1f);
  uVar3 = (cVar2.field_0._0_4_ >> 0x10) + (packed_color5 >> 5 & 0x1f);
  uVar4 = (int)cVar2.field_0._0_2_ + (packed_color5 >> 10 & 0x1f);
  uVar1 = uVar4 | uVar3 | uVar5;
  if (0x1f < uVar1) {
    if (0x1e < (int)uVar4) {
      uVar4 = 0x1f;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    if (0x1e < (int)uVar3) {
      uVar3 = 0x1f;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar6 = 0x1f;
    if ((int)uVar5 < 0x1f) {
      uVar6 = uVar5;
    }
    uVar5 = uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = 0;
    }
  }
  if (scaled) {
    uVar5 = uVar5 >> 2 | uVar5 * 8;
    uVar3 = (int)uVar3 >> 2 | uVar3 * 8;
    uVar4 = (int)uVar4 >> 2 | uVar4 * 8;
  }
  uVar7 = 0xff;
  if (alpha < 0xff) {
    uVar7 = alpha;
  }
  (result->field_0).m_comps[0] = (uint8_t)uVar4;
  (result->field_0).m_comps[1] = (uint8_t)uVar3;
  (result->field_0).m_comps[2] = (uint8_t)uVar5;
  (result->field_0).m_comps[3] = (uint8_t)uVar7;
  return uVar1 < 0x20;
}

Assistant:

bool etc_block::unpack_color5(color_rgba& result, uint16_t packed_color5, uint16_t packed_delta3, bool scaled, uint32_t alpha)
	{
		color_rgba_i16 dc(unpack_delta3(packed_delta3));

		int b = (packed_color5 & 31U) + dc.b;
		int g = ((packed_color5 >> 5U) & 31U) + dc.g;
		int r = ((packed_color5 >> 10U) & 31U) + dc.r;

		bool success = true;
		if (static_cast<uint32_t>(r | g | b) > 31U)
		{
			success = false;
			r = clamp<int>(r, 0, 31);
			g = clamp<int>(g, 0, 31);
			b = clamp<int>(b, 0, 31);
		}

		if (scaled)
		{
			b = (b << 3U) | (b >> 2U);
			g = (g << 3U) | (g >> 2U);
			r = (r << 3U) | (r >> 2U);
		}

		result.set_noclamp_rgba(r, g, b, minimum(alpha, 255U));
		return success;
	}